

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

int fct_ts__is_test_cnt(fct_ts_t *ts,int test_num)

{
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x50b
                  ,"int fct_ts__is_test_cnt(const fct_ts_t *, int)");
  }
  if (test_num < 0) {
    __assert_fail("0 <= test_num",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x50c
                  ,"int fct_ts__is_test_cnt(const fct_ts_t *, int)");
  }
  if (ts->total_test_num <= test_num) {
    __assert_fail("test_num < ts->total_test_num",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x50d
                  ,"int fct_ts__is_test_cnt(const fct_ts_t *, int)");
  }
  if (ts->mode != ts_mode_end) {
    return (int)(ts->curr_test_num == test_num);
  }
  __assert_fail("!((ts)->mode == ts_mode_end)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x50e,
                "int fct_ts__is_test_cnt(const fct_ts_t *, int)");
}

Assistant:

static nbool_t
fct_ts__is_test_cnt(fct_ts_t const *ts, int test_num)
{
    FCT_ASSERT( ts != NULL );
    FCT_ASSERT( 0 <= test_num );
    FCT_ASSERT( test_num < ts->total_test_num );
    FCT_ASSERT( !fct_ts__is_end(ts) );

    /* As we roll through the tests we increment the count. With this
    count we can decide if we need to execute a test or not. */
    return test_num == ts->curr_test_num;
}